

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void speak_pa_finished(void *userData)

{
  long *in_RDI;
  SpeakData *data;
  
  if (in_RDI != (long *)0x0) {
    if ((*in_RDI != 0) && ((*(byte *)((long)in_RDI + 0x21) & 1) == 0)) {
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    Pa_CloseStream(in_RDI[6]);
    *(undefined1 *)((long)in_RDI + 0x22) = 0;
    if ((*(byte *)((long)in_RDI + 0x21) & 1) == 0) {
      *(undefined1 *)((long)in_RDI + 0x24) = 1;
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x23) = 1;
    }
    if ((g_verbose & 1U) != 0) {
      if ((*(byte *)((long)in_RDI + 0x23) & 1) == 0) {
        console_message((char *)0x197356);
      }
      else {
        console_message((char *)0x197348);
      }
    }
    if ((in_RDI[5] != 0) && ((*(byte *)((long)in_RDI + 0x23) & 1) == 0)) {
      (*(code *)in_RDI[5])();
    }
  }
  return;
}

Assistant:

static void speak_pa_finished(void *userData)
{
	SpeakData *data = (SpeakData *)userData;
	if (data == NULL)
	{
		return;
	}

	if (data->data != NULL && !data->pause)
	{
		free(data->data);
		data->data = NULL;
	}

	Pa_CloseStream(data->stream);
	data->speaking = false;

	if (data->pause)
	{
		data->paused = true;
	}
	else
	{
		data->finished = true;
	}

	if (g_verbose)
	{
		if (data->paused)
		{
			console_message(u8"非同期発声一時停止\n");
		}
		else
		{
			console_message(u8"非同期発声完了\n");
		}
	}

	if (data->onFinished != NULL && !data->paused)
	{
		(data->onFinished)();
	}
}